

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O0

int mk_http_error(int http_status,mk_http_session *cs,mk_http_request *sr,mk_server *server)

{
  undefined8 uVar1;
  int iVar2;
  mk_list *__mptr;
  mk_iov *iov;
  file_info finfo;
  mk_list *head;
  mk_vhost_error_page *entry;
  mk_ptr_t page;
  mk_ptr_t message;
  size_t count;
  int fd;
  int ret;
  mk_server *server_local;
  mk_http_request *sr_local;
  mk_http_session *cs_local;
  int http_status_local;
  
  if (server->workers != 0) {
    mk_header_set_http_status(sr,http_status);
    mk_ptr_reset((mk_ptr_t *)&entry);
    if (((http_status != 0x19b) && (http_status != 400)) && (http_status != 0x19d)) {
      for (finfo._24_8_ = (sr->host_conf->error_pages).next; uVar1 = finfo._24_8_,
          (mk_list *)finfo._24_8_ != &sr->host_conf->error_pages;
          finfo._24_8_ = *(undefined8 *)(finfo._24_8_ + 8)) {
        if (*(short *)(finfo._24_8_ + -0x18) == http_status) {
          iVar2 = mk_file_get_info(*(char **)(finfo._24_8_ + -8),(file_info *)&iov,2);
          if ((iVar2 != -1) &&
             (iVar2 = open(*(char **)(uVar1 + -8),server->open_flags), iVar2 != -1)) {
            (sr->headers).content_length = (long)iov;
            (sr->headers).real_length = (long)iov;
            mk_header_prepare(cs,sr,server);
            mk_stream_in_file(&sr->stream,&sr->in_file,sr->file_fd,(size_t)iov,0,
                              (_func_void_mk_stream_input_ptr_long *)0x0,
                              (_func_void_mk_stream_input_ptr *)0x0);
            return 0;
          }
          break;
        }
      }
    }
    mk_ptr_reset((mk_ptr_t *)&page.len);
    if (http_status == 0x193) {
      mk_http_error_page("Forbidden",&sr->uri,server->server_signature,(char **)&entry,
                         (unsigned_long *)&page);
    }
    else if (http_status == 0x194) {
      mk_string_build((char **)&page.len,(unsigned_long *)&message,
                      "The requested URL was not found on this server.");
      mk_http_error_page("Not Found",(mk_ptr_t *)&page.len,server->server_signature,(char **)&entry,
                         (unsigned_long *)&page);
      mk_ptr_free((mk_ptr_t *)&page.len);
    }
    else if (http_status == 0x195) {
      mk_http_error_page("Method Not Allowed",&sr->uri,server->server_signature,(char **)&entry,
                         (unsigned_long *)&page);
    }
    else if (http_status == 0x19d) {
      mk_string_build((char **)&page.len,(unsigned_long *)&message,
                      "The request entity is too large.");
      mk_http_error_page("Entity too large",(mk_ptr_t *)&page.len,server->server_signature,
                         (char **)&entry,(unsigned_long *)&page);
      mk_ptr_free((mk_ptr_t *)&page.len);
    }
    else if (http_status == 500) {
      mk_http_error_page("Internal Server Error",&sr->uri,server->server_signature,(char **)&entry,
                         (unsigned_long *)&page);
    }
    else if (http_status == 0x1f5) {
      mk_http_error_page("Method Not Implemented",&sr->uri,server->server_signature,(char **)&entry,
                         (unsigned_long *)&page);
    }
    if (((page.data == (char *)0x0) || (sr->method == 2)) || (sr->method == 7)) {
      (sr->headers).content_length = 0;
    }
    else {
      (sr->headers).content_length = (long)page.data;
    }
    (sr->headers).location = (char *)0x0;
    (sr->headers).cgi = 0;
    (sr->headers).pconnections_left = 0;
    (sr->headers).last_modified = -1;
    if (entry == (mk_vhost_error_page *)0x0) {
      mk_ptr_reset(&(sr->headers).content_type);
    }
    else {
      mk_ptr_set(&(sr->headers).content_type,"Content-Type: text/html\r\n");
    }
    mk_header_prepare(cs,sr,server);
    if (entry != (mk_vhost_error_page *)0x0) {
      if (sr->method == 2) {
        mk_mem_free(entry);
      }
      else {
        if ((sr->headers)._extra_rows == (mk_iov *)0x0) {
          __mptr = (mk_list *)&(sr->headers).headers_iov;
          (sr->in_headers).bytes_total = (size_t)(page.data + (sr->in_headers).bytes_total);
        }
        else {
          __mptr = (mk_list *)(sr->headers)._extra_rows;
          (sr->in_headers_extra).bytes_total =
               (size_t)(page.data + (sr->in_headers_extra).bytes_total);
        }
        mk_iov_add((mk_iov *)__mptr,entry,(int)page.data,1);
      }
    }
    mk_channel_write(cs->channel,&message.len);
    mk_http_request_end(cs,server);
  }
  return 0;
}

Assistant:

int mk_http_error(int http_status, struct mk_http_session *cs,
                  struct mk_http_request *sr,
                  struct mk_server *server)
{
    int ret, fd;
    size_t count;
    mk_ptr_t message;
    mk_ptr_t page;
    struct mk_vhost_error_page *entry;
    struct mk_list *head;
    struct file_info finfo;
    struct mk_iov *iov;

    /* This function requires monkey to be properly initialized which is not the case
     * when it's just used to parse http requests in fluent-bit so we want it to ignore
     * that case and let fluent-bit handle it.
    */
    if (server->workers == 0) {
        return MK_EXIT_OK;
    }

    mk_header_set_http_status(sr, http_status);
    mk_ptr_reset(&page);

    /*
     * We are nice sending error pages for clients who at least respect
     * the especification
     */
    if (http_status != MK_CLIENT_LENGTH_REQUIRED &&
        http_status != MK_CLIENT_BAD_REQUEST &&
        http_status != MK_CLIENT_REQUEST_ENTITY_TOO_LARGE) {

        /* Lookup a customized error page */
        mk_list_foreach(head, &sr->host_conf->error_pages) {
            entry = mk_list_entry(head, struct mk_vhost_error_page, _head);
            if (entry->status != http_status) {
                continue;
            }

            /* validate error file */
            ret = mk_file_get_info(entry->real_path, &finfo, MK_FILE_READ);
            if (ret == -1) {
                break;
            }

            /* open file */
            fd = open(entry->real_path, server->open_flags);
            if (fd == -1) {
                break;
            }
            /* This fd seems to be leaked, we need to verify this logic */

            /* Outgoing headers */
            sr->headers.content_length = finfo.size;
            sr->headers.real_length    = finfo.size;
            mk_header_prepare(cs, sr, server);

            /* Stream setup */
            mk_stream_in_file(&sr->stream, &sr->in_file, sr->file_fd,
                              finfo.size, 0, NULL, NULL);
            return MK_EXIT_OK;
        }
    }

    mk_ptr_reset(&message);

    switch (http_status) {
    case MK_CLIENT_FORBIDDEN:
        mk_http_error_page("Forbidden",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    case MK_CLIENT_NOT_FOUND:
        mk_string_build(&message.data, &message.len,
                        "The requested URL was not found on this server.");
        mk_http_error_page("Not Found",
                           &message,
                           server->server_signature,
                           &page.data, &page.len);
        mk_ptr_free(&message);
        break;
    case MK_CLIENT_REQUEST_ENTITY_TOO_LARGE:
        mk_string_build(&message.data, &message.len,
                        "The request entity is too large.");
        mk_http_error_page("Entity too large",
                           &message,
                           server->server_signature,
                           &page.data, &page.len);
        mk_ptr_free(&message);
        break;
    case MK_CLIENT_METHOD_NOT_ALLOWED:
        mk_http_error_page("Method Not Allowed",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    case MK_SERVER_NOT_IMPLEMENTED:
        mk_http_error_page("Method Not Implemented",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    case MK_SERVER_INTERNAL_ERROR:
        mk_http_error_page("Internal Server Error",
                           &sr->uri,
                           server->server_signature,
                           &page.data, &page.len);
        break;
    }

    if (page.len > 0 && sr->method != MK_METHOD_HEAD && sr->method != MK_METHOD_UNKNOWN) {
        sr->headers.content_length = page.len;
    }
    else {
        sr->headers.content_length = 0;
    }

    sr->headers.location = NULL;
    sr->headers.cgi = SH_NOCGI;
    sr->headers.pconnections_left = 0;
    sr->headers.last_modified = -1;

    if (!page.data) {
        mk_ptr_reset(&sr->headers.content_type);
    }
    else {
        mk_ptr_set(&sr->headers.content_type, "Content-Type: text/html\r\n");
    }

    mk_header_prepare(cs, sr, server);
    if (page.data) {
        if (sr->method != MK_METHOD_HEAD) {
            if (sr->headers._extra_rows) {
                iov = sr->headers._extra_rows;
                sr->in_headers_extra.bytes_total += page.len;
            }
            else {
                iov = &sr->headers.headers_iov;
                sr->in_headers.bytes_total += page.len;
            }
            mk_iov_add(iov, page.data, page.len, MK_TRUE);
        }
        else {
            mk_mem_free(page.data);
        }
    }

    mk_channel_write(cs->channel, &count);
    mk_http_request_end(cs, server);

    return MK_EXIT_OK;
}